

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADS1115.h
# Opt level: O2

Error __thiscall
ADS1115::ADC<unix_i2c::i2c>::read_register
          (ADC<unix_i2c::i2c> *this,RegisterAddress reg_address,uint16_t *reg)

{
  Error EVar1;
  ssize_t sVar2;
  size_t in_RCX;
  ushort local_1b;
  RegisterAddress local_19 [6];
  uint8_t rx [2];
  uint8_t tx [1];
  
  local_19[0] = reg_address;
  EVar1 = unix_i2c::i2c::begin(&this->m_impl,this->m_address);
  if (EVar1 == NONE) {
    sVar2 = unix_i2c::i2c::write(&this->m_impl,(int)local_19,(void *)0x1,in_RCX);
    EVar1 = (Error)sVar2;
    if (EVar1 == NONE) {
      sVar2 = unix_i2c::i2c::read(&this->m_impl,(int)&local_1b,(void *)0x2,in_RCX);
      EVar1 = (Error)sVar2;
      if (EVar1 == NONE) {
        *reg = local_1b << 8 | local_1b >> 8;
        EVar1 = NONE;
      }
    }
  }
  return EVar1;
}

Assistant:

Error read_register(RegisterAddress reg_address, uint16_t& reg)
  {
    uint8_t tx[1] = {static_cast<uint8_t>(reg_address)};
    uint8_t rx[2];

    auto err = m_impl.begin(m_address);

    if (err == Error::NONE)
      err = m_impl.write(tx, 1);

    if (err == Error::NONE)
      err = m_impl.read(rx, 2);

    if (err == Error::NONE)
      reg = (rx[0] << 8) | rx[1];

    return err;
  }